

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocTestDocsSamples.cpp
# Opt level: O3

string * __thiscall
Greeting::getGreetingFor_abi_cxx11_
          (string *__return_storage_ptr__,Greeting *this,Nationality aNationality)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (aNationality == French) {
    pcVar2 = "Bonjour";
    pcVar1 = "";
  }
  else if (aNationality == American) {
    pcVar2 = "Howdy";
    pcVar1 = "";
  }
  else if (aNationality == British) {
    pcVar2 = "Cheers";
    pcVar1 = "";
  }
  else {
    pcVar2 = "Unknown";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string getGreetingFor(Nationality aNationality) const
    {
        switch (aNationality)
        {
        case British:
            return "Cheers";
        case American:
            return "Howdy";
        case French:
            return "Bonjour";
        default:
            return "Unknown";
        }
    }